

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yamc_barrier.hpp
# Opt level: O3

void __thiscall
yamc::barrier<counting_completion>::arrive_and_wait(barrier<counting_completion> *this)

{
  uint uVar1;
  int *piVar2;
  long lVar3;
  unique_lock<std::mutex> lk;
  unique_lock<std::mutex> local_30;
  
  local_30._M_device = &this->mtx_;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  if (this->counter_ < 1) {
    __assert_fail("0 < counter_",
                  "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/include/yamc_barrier.hpp"
                  ,0x80,
                  "void yamc::barrier<counting_completion>::arrive_and_wait() [CompletionFunction = counting_completion]"
                 );
  }
  uVar1 = this->phase_;
  lVar3 = this->counter_ + -1;
  this->counter_ = lVar3;
  if (lVar3 == 0) {
    piVar2 = (this->completion_).counter;
    *piVar2 = *piVar2 + 1;
    this->counter_ = this->init_count_;
    this->phase_ = this->phase_ + 1;
    std::condition_variable::notify_all();
    if (uVar1 < this->phase_) goto LAB_0012f805;
  }
  do {
    std::condition_variable::wait((unique_lock *)&this->cv_);
  } while (this->phase_ <= uVar1);
LAB_0012f805:
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return;
}

Assistant:

void arrive_and_wait()
  {
    // equivalent to wait(arrive())
    std::unique_lock<decltype(mtx_)> lk(mtx_);
    assert(0 < counter_);
    auto arrival_phase = phase_;
    counter_ -= 1;
    if (counter_ == 0) {
      phase_completion_step(false);
    }
    while (phase_ <= arrival_phase) {
      cv_.wait(lk);
    }
  }